

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
          *samples)

{
  ulong uVar1;
  pointer pRVar2;
  pointer pfVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  deUint64 *pdVar6;
  int *piVar7;
  pointer pRVar8;
  SampleBuilder *pSVar9;
  ulong target;
  long lVar10;
  int endNdx;
  long lVar11;
  size_type __n;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  RenderSampleAnalyzeResult RVar20;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_type __dnew_2;
  LineParametersWithConfidence contributionFitting;
  size_type __dnew_1;
  size_type __dnew;
  ScopedLogSection section_1;
  size_type __dnew_4;
  size_type __dnew_5;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section;
  ScopedLogSection section_2;
  StatsType resultStats;
  undefined1 local_ac0 [12];
  float fStack_ab4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab0;
  string local_aa0;
  string local_a80;
  qpSampleValueTag local_a60;
  float local_a5c;
  undefined1 local_a58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a48;
  string local_a38;
  string local_a18;
  qpSampleValueTag local_9f8;
  float local_9f4;
  LogNumber<float> local_9f0;
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_968;
  LogNumber<float> local_958;
  LogNumber<float> local_8f0;
  LogNumber<float> local_888;
  LogNumber<float> local_820;
  LogNumber<float> local_7b8;
  string local_750;
  LogNumber<float> local_730;
  LogNumber<float> local_6c8;
  LogNumber<float> local_660;
  string local_5f8;
  string local_5d8;
  LogNumber<float> local_5b8;
  LineParametersWithConfidence local_54c;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  string local_220;
  ScopedLogSection local_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  SingleOperationStatistics local_f8;
  SingleOperationStatistics local_e4;
  SingleOperationStatistics local_d0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  SingleOperationStatistics local_a8;
  float local_94;
  undefined4 uStack_90;
  float fStack_8c;
  float fStack_88;
  undefined4 local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            (&local_54c,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a58,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_ac0);
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 6;
  uVar13 = (uint)__n;
  if (0 < (int)uVar13) {
    pdVar6 = &(pRVar8->duration).fitResponseDuration;
    uVar12 = 0;
    do {
      *(deUint64 *)(local_a58._0_8_ + uVar12 * 8) = *pdVar6;
      uVar12 = uVar12 + 1;
      pdVar6 = pdVar6 + 8;
    } while ((uVar13 & 0x7fffffff) != uVar12);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac0,__n,(allocator_type *)&local_9f0);
  uVar4 = local_ac0._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8) >> 6);
  if (0 < (int)uVar13) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      *(float *)(local_ac0._0_8_ + uVar12 * 4) =
           (float)*piVar7 / (((float)*(ulong *)(local_a58._0_8_ + uVar12 * 8) / 1000.0) / 1000.0);
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x10;
    } while ((uVar13 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_ab4,local_ac0._8_4_);
  if ((pointer)local_ac0._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_ac0._0_8_ >> 2;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac0._0_8_,pfVar3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  uVar4 = local_ac0._0_8_;
  fVar15 = (float)((CONCAT44(fStack_ab4,local_ac0._8_4_) - local_ac0._0_8_ >> 2) - 1) * 0.5;
  fVar16 = floorf(fVar15);
  fVar15 = fVar15 - (float)(int)fVar16;
  local_94 = (1.0 - fVar15) * *(float *)(uVar4 + (long)(int)fVar16 * 4) +
             fVar15 * *(float *)(uVar4 + (long)((int)fVar16 + 1) * 4);
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,local_ab0._M_allocated_capacity - uVar4);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac0,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_9f0);
  uVar4 = local_ac0._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8) >> 6);
  if (0 < (int)uVar13) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      *(float *)(local_ac0._0_8_ + uVar12 * 4) =
           (float)*(ulong *)(local_a58._0_8_ + uVar12 * 8) -
           ((float)*piVar7 * local_54c.coefficient + local_54c.offset);
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x10;
    } while ((uVar13 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_ab4,local_ac0._8_4_);
  if ((pointer)local_ac0._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_ac0._0_8_ >> 2;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac0._0_8_,pfVar3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  uVar4 = local_ac0._0_8_;
  uStack_90 = *(undefined4 *)(CONCAT44(fStack_ab4,local_ac0._8_4_) + -4);
  fVar16 = (float)((CONCAT44(fStack_ab4,local_ac0._8_4_) - local_ac0._0_8_ >> 2) - 1);
  local_988._0_4_ = fVar16 * 0.9;
  fVar15 = floorf((float)local_988._0_4_);
  fStack_8c = (1.0 - ((float)local_988._0_4_ - (float)(int)fVar15)) *
              *(float *)(uVar4 + (long)(int)fVar15 * 4) +
              ((float)local_988._0_4_ - (float)(int)fVar15) *
              *(float *)(uVar4 + (long)((int)fVar15 + 1) * 4);
  fVar16 = fVar16 * 0.5;
  fVar15 = floorf(fVar16);
  fVar16 = fVar16 - (float)(int)fVar15;
  fStack_88 = (1.0 - fVar16) * *(float *)(uVar4 + (long)(int)fVar15 * 4) +
              fVar16 * *(float *)(uVar4 + (long)((int)fVar15 + 1) * 4);
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,local_ab0._M_allocated_capacity - uVar4);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac0,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_9f0);
  uVar4 = local_ac0._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8) >> 6);
  if (0 < (int)uVar13) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      fVar15 = (float)*piVar7 * local_54c.coefficient + local_54c.offset;
      fVar16 = 0.0;
      if (1.0 <= fVar15) {
        fVar16 = ((float)*(ulong *)(local_a58._0_8_ + uVar12 * 8) - fVar15) / fVar15;
      }
      *(float *)(local_ac0._0_8_ + uVar12 * 4) = fVar16;
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x10;
    } while ((uVar13 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_ab4,local_ac0._8_4_);
  if ((pointer)local_ac0._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_ac0._0_8_ >> 2;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac0._0_8_,pfVar3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  local_84 = *(undefined4 *)(CONCAT44(fStack_ab4,local_ac0._8_4_) + -4);
  fVar16 = (float)((CONCAT44(fStack_ab4,local_ac0._8_4_) - local_ac0._0_8_ >> 2) - 1);
  fVar15 = fVar16 * 0.9;
  local_988._0_4_ = fVar15;
  fVar15 = floorf(fVar15);
  local_80 = (1.0 - ((float)local_988._0_4_ - (float)(int)fVar15)) *
             *(float *)(local_ac0._0_8_ + (long)(int)fVar15 * 4) +
             ((float)local_988._0_4_ - (float)(int)fVar15) *
             *(float *)(local_ac0._0_8_ + (long)((int)fVar15 + 1) * 4);
  fVar16 = fVar16 * 0.5;
  fVar15 = floorf(fVar16);
  fVar16 = fVar16 - (float)(int)fVar15;
  local_7c = (1.0 - fVar16) * *(float *)(local_ac0._0_8_ + (long)(int)fVar15 * 4) +
             fVar16 * *(float *)(local_ac0._0_8_ + (long)((int)fVar15 + 1) * 4);
  if ((pointer)local_ac0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity - local_ac0._0_8_);
  }
  uVar5 = local_a58._8_8_;
  uVar4 = local_a58._0_8_;
  if (local_a58._0_8_ != local_a58._8_8_) {
    uVar12 = (long)(local_a58._8_8_ - local_a58._0_8_) >> 3;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a58._0_8_,local_a58._8_8_,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,uVar5);
  }
  local_bc = (float)*(ulong *)local_a58._0_8_;
  local_b8 = (float)(ulong)(((pointer)(local_a58._8_8_ + -0x10))->value).int64;
  fVar16 = (float)(((long)(local_a58._8_8_ - local_a58._0_8_) >> 3) - 1);
  local_988._0_4_ = fVar16 * 0.5;
  fVar15 = floorf(fVar16 * 0.5);
  local_b4 = (float)*(ulong *)(local_a58._0_8_ + (long)((int)fVar15 + 1) * 8) *
             ((float)local_988._0_4_ - (float)(int)fVar15) +
             (float)*(ulong *)(local_a58._0_8_ + (long)(int)fVar15 * 8) *
             (1.0 - ((float)local_988._0_4_ - (float)(int)fVar15));
  local_988._0_4_ = fVar16 * 0.1;
  fVar15 = floorf(fVar16 * 0.1);
  local_b0 = (float)*(ulong *)(local_a58._0_8_ + (long)((int)fVar15 + 1) * 8) *
             ((float)local_988._0_4_ - (float)(int)fVar15) +
             (float)*(ulong *)(local_a58._0_8_ + (long)(int)fVar15 * 8) *
             (1.0 - ((float)local_988._0_4_ - (float)(int)fVar15));
  fVar15 = floorf(fVar16 * 0.9);
  uVar12 = *(ulong *)(local_a58._0_8_ + (long)(int)fVar15 * 8);
  target = uVar12;
  if ((long)uVar12 < 0) {
    target = (ulong)((uint)uVar12 & 1) | uVar12 >> 1;
  }
  fVar16 = fVar16 * 0.9 - (float)(int)fVar15;
  uVar1 = *(ulong *)(local_a58._0_8_ + (long)((int)fVar15 + 1) * 8);
  if ((long)uVar1 < 0) {
    target = uVar1 >> 1;
  }
  local_ac = (float)uVar1 * fVar16 + (float)uVar12 * (1.0 - fVar16);
  operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity - local_a58._0_8_);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&local_f8,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x0,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&local_e4,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x8,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&local_d0,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x10,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&local_a8,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x18,target);
  local_a58._0_8_ = &aStack_a48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a58,"Samples","");
  local_ac0._0_8_ = &local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_220,log,(string *)local_a58,(string *)local_ac0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  local_730.m_name._M_dataplus._M_p = (pointer)&local_730.m_name.field_2;
  local_730.m_name._M_string_length = 7;
  local_730.m_name.field_2._M_allocated_capacity = 0x73656c706d6153;
  local_5b8.m_name._M_dataplus._M_p = (pointer)&local_5b8.m_name.field_2;
  local_5b8.m_name.field_2._M_allocated_capacity._0_2_ = 0x6153;
  local_5b8.m_name.field_2._M_local_buf[2] = 'm';
  local_5b8.m_name.field_2._M_allocated_capacity._3_4_ = 0x73656c70;
  local_5b8.m_name._M_string_length = 7;
  local_5b8.m_name.field_2._M_local_buf[7] = '\0';
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_8f0,&local_730.m_name,&local_5b8.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_8f0.m_name,&local_8f0.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_968._M_allocated_capacity = 0x657a695361746144;
  local_978._8_8_ = 8;
  local_968._M_local_buf[8] = '\0';
  local_750.field_2._M_allocated_capacity._0_6_ = 0x702061746144;
  local_750.field_2._M_allocated_capacity._6_2_ = 0x6f72;
  local_750.field_2._8_6_ = 0x646573736563;
  local_750._M_string_length = 0xe;
  local_750.field_2._M_local_buf[0xe] = '\0';
  local_270.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_270.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_270._M_string_length = 5;
  local_978._0_8_ = &local_968;
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a58,(string *)local_978,&local_750,&local_270,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a58,&local_a38,&local_a18,local_9f8);
  local_290.field_2._M_allocated_capacity = 0x695364616f6c7055;
  local_290.field_2._8_2_ = 0x657a;
  local_290._M_string_length = 10;
  local_290.field_2._M_local_buf[10] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  local_2b0.field_2._M_allocated_capacity._0_5_ = 0x2061746144;
  local_2b0.field_2._M_allocated_capacity._5_3_ = 0x6c7075;
  local_2b0.field_2._8_5_ = 0x646564616f;
  local_2b0._M_string_length = 0xd;
  local_2b0.field_2._M_local_buf[0xd] = '\0';
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_2d0.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_2d0._M_string_length = 5;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_ac0,&local_290,&local_2b0,&local_2d0,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_ac0,&local_aa0,&local_a80,local_a60);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0.field_2._M_allocated_capacity._0_7_ = 0x43786574726556;
  local_2f0.field_2._7_4_ = 0x746e756f;
  local_2f0._M_string_length = 0xb;
  local_2f0.field_2._M_local_buf[0xb] = '\0';
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  local_820.m_name._M_dataplus._M_p = (pointer)0x12;
  local_5d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5d8,(ulong)&local_820);
  local_5d8.field_2._M_allocated_capacity = (size_type)local_820.m_name._M_dataplus._M_p;
  builtin_strncpy(local_5d8._M_dataplus._M_p,"Number of vertices",0x12);
  local_5d8._M_string_length = (size_type)local_820.m_name._M_dataplus._M_p;
  local_5d8._M_dataplus._M_p[(long)local_820.m_name._M_dataplus._M_p] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310.field_2._M_allocated_capacity = 0x7365636974726576;
  local_310._M_string_length = 8;
  local_310.field_2._M_local_buf[8] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_9f0,&local_2f0,&local_5d8,&local_310,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo
            (log,&local_9f0.m_name,&local_9f0.m_desc,&local_9f0.m_unit,local_9f0.m_tag);
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330.field_2._M_allocated_capacity = 0x6461655277617244;
  local_330.field_2._8_4_ = 0x656d6954;
  local_330._M_string_length = 0xc;
  local_330.field_2._M_local_buf[0xc] = '\0';
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  local_888.m_name._M_dataplus._M_p = (pointer)0x1d;
  local_5f8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5f8,(ulong)&local_888);
  local_5f8.field_2._M_allocated_capacity = (size_type)local_888.m_name._M_dataplus._M_p;
  builtin_strncpy(local_5f8._M_dataplus._M_p,"Draw call and ReadPixels time",0x1d);
  local_5f8._M_string_length = (size_type)local_888.m_name._M_dataplus._M_p;
  local_5f8._M_dataplus._M_p[(long)local_888.m_name._M_dataplus._M_p] = '\0';
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_350._M_string_length = 2;
  local_350.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_820,&local_330,&local_5f8,&local_350,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_820.m_name,&local_820.m_desc,&local_820.m_unit,local_820.m_tag);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  local_370.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_370.field_2._8_2_ = 0x65;
  local_370._M_string_length = 9;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_390.field_2._8_2_ = 0x656d;
  local_390._M_string_length = 10;
  local_390.field_2._M_local_buf[10] = '\0';
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_3b0._M_string_length = 2;
  local_3b0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_888,&local_370,&local_390,&local_3b0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_888.m_name,&local_888.m_desc,&local_888.m_unit,local_888.m_tag);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_3d0.field_2._7_4_ = 0x656d6974;
  local_3d0._M_string_length = 0xb;
  local_3d0.field_2._M_local_buf[0xb] = '\0';
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_3f0.field_2._7_4_ = 0x656d6974;
  local_3f0._M_string_length = 0xb;
  local_3f0.field_2._M_local_buf[0xb] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_410._M_string_length = 2;
  local_410.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_660,&local_3d0,&local_3f0,&local_410,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_660.m_name,&local_660.m_desc,&local_660.m_unit,local_660.m_tag);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430.field_2._M_allocated_capacity = 0x6c6c614377617244;
  local_430.field_2._8_4_ = 0x656d6954;
  local_430._M_string_length = 0xc;
  local_430.field_2._M_local_buf[0xc] = '\0';
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_450.field_2._M_allocated_capacity._0_6_ = 0x632077617244;
  local_450.field_2._M_allocated_capacity._6_2_ = 0x6c61;
  local_450.field_2._8_6_ = 0x656d6974206c;
  local_450._M_string_length = 0xe;
  local_450.field_2._M_local_buf[0xe] = '\0';
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_470.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_470._M_string_length = 2;
  local_470.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_958,&local_430,&local_450,&local_470,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_958.m_name,&local_958.m_desc,&local_958.m_unit,local_958.m_tag);
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  local_490.field_2._M_allocated_capacity = 0x656d695464616552;
  local_490._M_string_length = 8;
  local_490.field_2._M_local_buf[8] = '\0';
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0.field_2._M_allocated_capacity._0_7_ = 0x78695064616552;
  local_4b0.field_2._M_local_buf[7] = 'e';
  local_4b0.field_2._8_7_ = 0x656d697420736c;
  local_4b0._M_string_length = 0xf;
  local_4b0.field_2._M_local_buf[0xf] = '\0';
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  local_4d0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4d0._M_string_length = 2;
  local_4d0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7b8,&local_490,&local_4b0,&local_4d0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_7b8.m_name,&local_7b8.m_desc,&local_7b8.m_unit,local_7b8.m_tag);
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  local_4f0.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_4f0.field_2._7_4_ = 0x6c617564;
  local_4f0._M_string_length = 0xb;
  local_4f0.field_2._M_local_buf[0xb] = '\0';
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  local_510.field_2._M_allocated_capacity = 0x6973657220746946;
  local_510.field_2._8_4_ = 0x6c617564;
  local_510._M_string_length = 0xc;
  local_510.field_2._M_local_buf[0xc] = '\0';
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  local_530.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_530._M_string_length = 2;
  local_530.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_6c8,&local_4f0,&local_510,&local_530,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_6c8.m_name,&local_6c8.m_desc,&local_6c8.m_unit,local_6c8.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_unit._M_dataplus._M_p != &local_6c8.m_unit.field_2) {
    operator_delete(local_6c8.m_unit._M_dataplus._M_p,
                    local_6c8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_desc._M_dataplus._M_p != &local_6c8.m_desc.field_2) {
    operator_delete(local_6c8.m_desc._M_dataplus._M_p,
                    local_6c8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
    operator_delete(local_6c8.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,
                    CONCAT53(local_530.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_530.field_2._M_local_buf[2],
                                      local_530.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,
                    CONCAT17(local_4f0.field_2._M_local_buf[7],
                             local_4f0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_unit._M_dataplus._M_p != &local_7b8.m_unit.field_2) {
    operator_delete(local_7b8.m_unit._M_dataplus._M_p,
                    local_7b8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_desc._M_dataplus._M_p != &local_7b8.m_desc.field_2) {
    operator_delete(local_7b8.m_desc._M_dataplus._M_p,
                    local_7b8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_name._M_dataplus._M_p != &local_7b8.m_name.field_2) {
    operator_delete(local_7b8.m_name._M_dataplus._M_p,
                    local_7b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT53(local_4d0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4d0.field_2._M_local_buf[2],
                                      local_4d0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT17(local_4b0.field_2._M_local_buf[7],
                             local_4b0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_unit._M_dataplus._M_p != &local_958.m_unit.field_2) {
    operator_delete(local_958.m_unit._M_dataplus._M_p,
                    local_958.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_desc._M_dataplus._M_p != &local_958.m_desc.field_2) {
    operator_delete(local_958.m_desc._M_dataplus._M_p,
                    local_958.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_958.m_name.field_2._M_local_buf[6],
                                      local_958.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT53(local_470.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_470.field_2._M_local_buf[2],
                                      local_470.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT26(local_450.field_2._M_allocated_capacity._6_2_,
                             local_450.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_unit._M_dataplus._M_p != &local_660.m_unit.field_2) {
    operator_delete(local_660.m_unit._M_dataplus._M_p,
                    local_660.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_desc._M_dataplus._M_p != &local_660.m_desc.field_2) {
    operator_delete(local_660.m_desc._M_dataplus._M_p,
                    local_660.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT53(local_660.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_660.m_name.field_2._M_local_buf[2],
                                      local_660.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,
                    CONCAT53(local_410.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_410.field_2._M_local_buf[2],
                                      local_410.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT17(local_3f0.field_2._M_local_buf[7],
                             local_3f0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT17(local_3d0.field_2._M_local_buf[7],
                             local_3d0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_unit._M_dataplus._M_p != &local_888.m_unit.field_2) {
    operator_delete(local_888.m_unit._M_dataplus._M_p,
                    local_888.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_desc._M_dataplus._M_p != &local_888.m_desc.field_2) {
    operator_delete(local_888.m_desc._M_dataplus._M_p,
                    local_888.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_name._M_dataplus._M_p != &local_888.m_name.field_2) {
    operator_delete(local_888.m_name._M_dataplus._M_p,
                    local_888.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT53(local_3b0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3b0.field_2._M_local_buf[2],
                                      local_3b0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_unit._M_dataplus._M_p != &local_820.m_unit.field_2) {
    operator_delete(local_820.m_unit._M_dataplus._M_p,
                    local_820.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_desc._M_dataplus._M_p != &local_820.m_desc.field_2) {
    operator_delete(local_820.m_desc._M_dataplus._M_p,
                    local_820.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_name._M_dataplus._M_p != &local_820.m_name.field_2) {
    operator_delete(local_820.m_name._M_dataplus._M_p,
                    local_820.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,
                    CONCAT53(local_350.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_350.field_2._M_local_buf[2],
                                      local_350.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,(ulong)(local_5f8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_unit._M_dataplus._M_p != &local_9f0.m_unit.field_2) {
    operator_delete(local_9f0.m_unit._M_dataplus._M_p,
                    local_9f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_desc._M_dataplus._M_p != &local_9f0.m_desc.field_2) {
    operator_delete(local_9f0.m_desc._M_dataplus._M_p,
                    local_9f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_name._M_dataplus._M_p != &local_9f0.m_name.field_2) {
    operator_delete(local_9f0.m_name._M_dataplus._M_p,
                    local_9f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,(ulong)(local_5d8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,
                    CONCAT17(local_2f0.field_2._M_local_buf[7],
                             local_2f0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,
                    CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2d0.field_2._M_allocated_capacity._4_2_,
                                      local_2d0.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT35(local_2b0.field_2._M_allocated_capacity._5_3_,
                             local_2b0.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT26(local_270.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                      local_270.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,
                    CONCAT26(local_750.field_2._M_allocated_capacity._6_2_,
                             local_750.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._0_8_ != &local_968) {
    operator_delete((void *)local_978._0_8_,local_968._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_desc._M_dataplus._M_p != &local_8f0.m_desc.field_2) {
    operator_delete(local_8f0.m_desc._M_dataplus._M_p,
                    local_8f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_name._M_dataplus._M_p != &local_8f0.m_name.field_2) {
    operator_delete(local_8f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8f0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8f0.m_name.field_2._M_local_buf[6],
                                      local_8f0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.m_name._M_dataplus._M_p != &local_5b8.m_name.field_2) {
    operator_delete(local_5b8.m_name._M_dataplus._M_p,
                    CONCAT17(local_5b8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_5b8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_5b8.m_name.field_2._M_local_buf[2],
                                               local_5b8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.m_name._M_dataplus._M_p != &local_730.m_name.field_2) {
    operator_delete(local_730.m_name._M_dataplus._M_p,
                    local_730.m_name.field_2._M_allocated_capacity + 1);
  }
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8) >> 6)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      uVar12 = *(ulong *)((long)&(pRVar8->duration).fitResponseDuration + lVar11);
      local_988._0_4_ =
           (float)*(int *)((long)&pRVar8->renderDataSize + lVar11) * local_54c.coefficient +
           local_54c.offset;
      local_a58._8_8_ = (pointer)0x0;
      aStack_a48._M_allocated_capacity = 0;
      aStack_a48._8_8_ = 0;
      local_a58._0_8_ = log;
      pSVar9 = tcu::SampleBuilder::operator<<
                         ((SampleBuilder *)local_a58,
                          *(int *)((long)&pRVar8->renderDataSize + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&((samples->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 uploadedDataSize + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&((samples->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 numVertices + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).renderReadDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).totalDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).uploadDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).renderDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).readDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,(float)uVar12 - (float)local_988._0_4_);
      tcu::SampleBuilder::operator<<(pSVar9,(EndSampleToken *)&tcu::TestLog::EndSample);
      if ((pointer)local_a58._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a58._8_8_,aStack_a48._8_8_ - local_a58._8_8_);
      }
      lVar10 = lVar10 + 1;
      pRVar8 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x40;
    } while (lVar10 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8
                                   ) >> 6));
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_220._M_dataplus._M_p);
  local_a58._0_8_ = &aStack_a48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a58,"Contribution","");
  local_ac0._0_8_ = &local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"Contributions","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_750,log,(string *)local_a58,(string *)local_ac0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_978,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0);
  local_820.m_name._M_dataplus._M_p = (pointer)&local_820.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"UploadConstantCost","");
  local_888.m_name._M_dataplus._M_p = (pointer)&local_888.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_888,"Upload: Approximated contant cost","");
  local_660.m_name._M_dataplus._M_p = (pointer)&local_660.m_name.field_2;
  local_660.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_660.m_name._M_string_length = 2;
  local_660.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a58,&local_820.m_name,&local_888.m_name,&local_660.m_name,
             QP_KEY_TAG_TIME,(float)local_978._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a58._0_8_,local_a38._M_dataplus._M_p,local_a18._M_dataplus._M_p,
             local_9f8,local_9f4);
  local_958.m_name._M_dataplus._M_p = (pointer)&local_958.m_name.field_2;
  local_9f0.m_name._M_dataplus._M_p = (pointer)0x10;
  local_958.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_958,(ulong)&local_9f0);
  local_958.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_9f0.m_name._M_dataplus._M_p,0);
  local_958.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_9f0.m_name._M_dataplus._M_p >> 0x30);
  local_958.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_9f0.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_958.m_name._M_dataplus._M_p,"UploadLinearCost",0x10);
  local_958.m_name._M_string_length = (size_type)local_9f0.m_name._M_dataplus._M_p;
  local_958.m_name._M_dataplus._M_p[(long)local_9f0.m_name._M_dataplus._M_p] = '\0';
  local_7b8.m_name._M_dataplus._M_p = (pointer)&local_7b8.m_name.field_2;
  local_9f0.m_name._M_dataplus._M_p = (char *)0x20;
  local_7b8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7b8,(ulong)&local_9f0);
  local_7b8.m_name.field_2._M_allocated_capacity = (size_type)local_9f0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7b8.m_name._M_dataplus._M_p,"Upload: Approximated linear cost",0x20);
  local_7b8.m_name._M_string_length = (size_type)local_9f0.m_name._M_dataplus._M_p;
  local_7b8.m_name._M_dataplus._M_p[(long)local_9f0.m_name._M_dataplus._M_p] = '\0';
  local_6c8.m_name._M_dataplus._M_p = (pointer)&local_6c8.m_name.field_2;
  local_6c8.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c8.m_name._M_string_length = 7;
  local_6c8.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_958.m_name,&local_7b8.m_name,&local_6c8.m_name,
             QP_KEY_TAG_TIME,(float)local_978._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ac0._0_8_,local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,
             local_a60,local_a5c);
  local_8f0.m_name._M_dataplus._M_p = (pointer)&local_8f0.m_name.field_2;
  local_730.m_name._M_dataplus._M_p = (pointer)0x10;
  local_8f0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_8f0,(ulong)&local_730);
  local_8f0.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_730.m_name._M_dataplus._M_p,0);
  local_8f0.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_730.m_name._M_dataplus._M_p >> 0x30);
  local_8f0.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_730.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_8f0.m_name._M_dataplus._M_p,"UploadMedianCost",0x10);
  local_8f0.m_name._M_string_length = (size_type)local_730.m_name._M_dataplus._M_p;
  local_8f0.m_name._M_dataplus._M_p[(long)local_730.m_name._M_dataplus._M_p] = '\0';
  local_730.m_name._M_dataplus._M_p = (pointer)&local_730.m_name.field_2;
  local_5b8.m_name._M_dataplus._M_p = &DAT_00000013;
  local_730.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_730,(ulong)&local_5b8);
  local_730.m_name.field_2._M_allocated_capacity = (size_type)local_5b8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_730.m_name._M_dataplus._M_p,"Upload: Median cost",0x13);
  local_730.m_name._M_string_length = (size_type)local_5b8.m_name._M_dataplus._M_p;
  local_730.m_name._M_dataplus._M_p[(long)local_5b8.m_name._M_dataplus._M_p] = '\0';
  local_5b8.m_name._M_dataplus._M_p = (pointer)&local_5b8.m_name.field_2;
  local_5b8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5b8.m_name._M_string_length = 2;
  local_5b8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_9f0,&local_8f0.m_name,&local_730.m_name,&local_5b8.m_name,QP_KEY_TAG_TIME,
             local_f8.medianTime);
  tcu::TestLog::writeFloat
            (log,local_9f0.m_name._M_dataplus._M_p,local_9f0.m_desc._M_dataplus._M_p,
             local_9f0.m_unit._M_dataplus._M_p,local_9f0.m_tag,local_9f0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_unit._M_dataplus._M_p != &local_9f0.m_unit.field_2) {
    operator_delete(local_9f0.m_unit._M_dataplus._M_p,
                    local_9f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_desc._M_dataplus._M_p != &local_9f0.m_desc.field_2) {
    operator_delete(local_9f0.m_desc._M_dataplus._M_p,
                    local_9f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_name._M_dataplus._M_p != &local_9f0.m_name.field_2) {
    operator_delete(local_9f0.m_name._M_dataplus._M_p,
                    local_9f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.m_name._M_dataplus._M_p != &local_5b8.m_name.field_2) {
    operator_delete(local_5b8.m_name._M_dataplus._M_p,
                    CONCAT17(local_5b8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_5b8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_5b8.m_name.field_2._M_local_buf[2],
                                               local_5b8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.m_name._M_dataplus._M_p != &local_730.m_name.field_2) {
    operator_delete(local_730.m_name._M_dataplus._M_p,
                    (ulong)(local_730.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_name._M_dataplus._M_p != &local_8f0.m_name.field_2) {
    operator_delete(local_8f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8f0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8f0.m_name.field_2._M_local_buf[6],
                                      local_8f0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
    operator_delete(local_6c8.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_name._M_dataplus._M_p != &local_7b8.m_name.field_2) {
    operator_delete(local_7b8.m_name._M_dataplus._M_p,
                    (ulong)(local_7b8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_958.m_name.field_2._M_local_buf[6],
                                      local_958.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT53(local_660.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_660.m_name.field_2._M_local_buf[2],
                                      local_660.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_name._M_dataplus._M_p != &local_888.m_name.field_2) {
    operator_delete(local_888.m_name._M_dataplus._M_p,
                    local_888.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_name._M_dataplus._M_p != &local_820.m_name.field_2) {
    operator_delete(local_820.m_name._M_dataplus._M_p,
                    local_820.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_978,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,8);
  local_820.m_name._M_dataplus._M_p = (pointer)&local_820.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"DrawCallConstantCost","");
  local_888.m_name._M_dataplus._M_p = (pointer)&local_888.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_888,"DrawCall: Approximated contant cost","");
  local_660.m_name._M_dataplus._M_p = (pointer)&local_660.m_name.field_2;
  local_660.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_660.m_name._M_string_length = 2;
  local_660.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a58,&local_820.m_name,&local_888.m_name,&local_660.m_name,
             QP_KEY_TAG_TIME,(float)local_978._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a58._0_8_,local_a38._M_dataplus._M_p,local_a18._M_dataplus._M_p,
             local_9f8,local_9f4);
  local_958.m_name._M_dataplus._M_p = (pointer)&local_958.m_name.field_2;
  local_9f0.m_name._M_dataplus._M_p = (pointer)0x12;
  local_958.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_958,(ulong)&local_9f0);
  local_958.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_9f0.m_name._M_dataplus._M_p,0);
  local_958.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_9f0.m_name._M_dataplus._M_p >> 0x30);
  local_958.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_9f0.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_958.m_name._M_dataplus._M_p,"DrawCallLinearCost",0x12);
  local_958.m_name._M_string_length = (size_type)local_9f0.m_name._M_dataplus._M_p;
  local_958.m_name._M_dataplus._M_p[(long)local_9f0.m_name._M_dataplus._M_p] = '\0';
  local_7b8.m_name._M_dataplus._M_p = (pointer)&local_7b8.m_name.field_2;
  local_9f0.m_name._M_dataplus._M_p = (char *)0x22;
  local_7b8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7b8,(ulong)&local_9f0);
  local_7b8.m_name.field_2._M_allocated_capacity = (size_type)local_9f0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7b8.m_name._M_dataplus._M_p,"DrawCall: Approximated linear cost",0x22);
  local_7b8.m_name._M_string_length = (size_type)local_9f0.m_name._M_dataplus._M_p;
  local_7b8.m_name._M_dataplus._M_p[(long)local_9f0.m_name._M_dataplus._M_p] = '\0';
  local_6c8.m_name._M_dataplus._M_p = (pointer)&local_6c8.m_name.field_2;
  local_6c8.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c8.m_name._M_string_length = 7;
  local_6c8.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_958.m_name,&local_7b8.m_name,&local_6c8.m_name,
             QP_KEY_TAG_TIME,(float)local_978._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ac0._0_8_,local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,
             local_a60,local_a5c);
  local_8f0.m_name._M_dataplus._M_p = (pointer)&local_8f0.m_name.field_2;
  local_730.m_name._M_dataplus._M_p = (pointer)0x12;
  local_8f0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_8f0,(ulong)&local_730);
  local_8f0.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_730.m_name._M_dataplus._M_p,0);
  local_8f0.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_730.m_name._M_dataplus._M_p >> 0x30);
  local_8f0.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_730.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_8f0.m_name._M_dataplus._M_p,"DrawCallMedianCost",0x12);
  local_8f0.m_name._M_string_length = (size_type)local_730.m_name._M_dataplus._M_p;
  local_8f0.m_name._M_dataplus._M_p[(long)local_730.m_name._M_dataplus._M_p] = '\0';
  local_730.m_name._M_dataplus._M_p = (pointer)&local_730.m_name.field_2;
  local_5b8.m_name._M_dataplus._M_p = (pointer)0x15;
  local_730.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_730,(ulong)&local_5b8);
  local_730.m_name.field_2._M_allocated_capacity = (size_type)local_5b8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_730.m_name._M_dataplus._M_p,"DrawCall: Median cost",0x15);
  local_730.m_name._M_string_length = (size_type)local_5b8.m_name._M_dataplus._M_p;
  local_730.m_name._M_dataplus._M_p[(long)local_5b8.m_name._M_dataplus._M_p] = '\0';
  local_5b8.m_name._M_dataplus._M_p = (pointer)&local_5b8.m_name.field_2;
  local_5b8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5b8.m_name._M_string_length = 2;
  local_5b8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_9f0,&local_8f0.m_name,&local_730.m_name,&local_5b8.m_name,QP_KEY_TAG_TIME,
             local_e4.medianTime);
  tcu::TestLog::writeFloat
            (log,local_9f0.m_name._M_dataplus._M_p,local_9f0.m_desc._M_dataplus._M_p,
             local_9f0.m_unit._M_dataplus._M_p,local_9f0.m_tag,local_9f0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_unit._M_dataplus._M_p != &local_9f0.m_unit.field_2) {
    operator_delete(local_9f0.m_unit._M_dataplus._M_p,
                    local_9f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_desc._M_dataplus._M_p != &local_9f0.m_desc.field_2) {
    operator_delete(local_9f0.m_desc._M_dataplus._M_p,
                    local_9f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_name._M_dataplus._M_p != &local_9f0.m_name.field_2) {
    operator_delete(local_9f0.m_name._M_dataplus._M_p,
                    local_9f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.m_name._M_dataplus._M_p != &local_5b8.m_name.field_2) {
    operator_delete(local_5b8.m_name._M_dataplus._M_p,
                    CONCAT17(local_5b8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_5b8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_5b8.m_name.field_2._M_local_buf[2],
                                               local_5b8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.m_name._M_dataplus._M_p != &local_730.m_name.field_2) {
    operator_delete(local_730.m_name._M_dataplus._M_p,
                    local_730.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_name._M_dataplus._M_p != &local_8f0.m_name.field_2) {
    operator_delete(local_8f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8f0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8f0.m_name.field_2._M_local_buf[6],
                                      local_8f0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
    operator_delete(local_6c8.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_name._M_dataplus._M_p != &local_7b8.m_name.field_2) {
    operator_delete(local_7b8.m_name._M_dataplus._M_p,
                    (ulong)(local_7b8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_958.m_name.field_2._M_local_buf[6],
                                      local_958.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT53(local_660.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_660.m_name.field_2._M_local_buf[2],
                                      local_660.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_name._M_dataplus._M_p != &local_888.m_name.field_2) {
    operator_delete(local_888.m_name._M_dataplus._M_p,
                    local_888.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_name._M_dataplus._M_p != &local_820.m_name.field_2) {
    operator_delete(local_820.m_name._M_dataplus._M_p,
                    local_820.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_978,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x10);
  local_820.m_name._M_dataplus._M_p = (pointer)&local_820.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"ReadConstantCost","");
  local_888.m_name._M_dataplus._M_p = (pointer)&local_888.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_888,"Read: Approximated contant cost","");
  local_660.m_name._M_dataplus._M_p = (pointer)&local_660.m_name.field_2;
  local_660.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_660.m_name._M_string_length = 2;
  local_660.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a58,&local_820.m_name,&local_888.m_name,&local_660.m_name,
             QP_KEY_TAG_TIME,(float)local_978._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a58._0_8_,local_a38._M_dataplus._M_p,local_a18._M_dataplus._M_p,
             local_9f8,local_9f4);
  local_958.m_name._M_dataplus._M_p = (pointer)&local_958.m_name.field_2;
  local_958.m_name.field_2._M_allocated_capacity._0_6_ = 0x694c64616552;
  local_958.m_name.field_2._M_local_buf[6] = 'n';
  local_958.m_name.field_2._M_local_buf[7] = 'e';
  local_958.m_name.field_2._8_6_ = 0x74736f437261;
  local_958.m_name._M_string_length = 0xe;
  local_958.m_name.field_2._M_local_buf[0xe] = '\0';
  local_7b8.m_name._M_dataplus._M_p = (pointer)&local_7b8.m_name.field_2;
  local_9f0.m_name._M_dataplus._M_p = (char *)0x1e;
  local_7b8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7b8,(ulong)&local_9f0);
  local_7b8.m_name.field_2._M_allocated_capacity = (size_type)local_9f0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7b8.m_name._M_dataplus._M_p,"Read: Approximated linear cost",0x1e);
  local_7b8.m_name._M_string_length = (size_type)local_9f0.m_name._M_dataplus._M_p;
  local_7b8.m_name._M_dataplus._M_p[(long)local_9f0.m_name._M_dataplus._M_p] = '\0';
  local_6c8.m_name._M_dataplus._M_p = (pointer)&local_6c8.m_name.field_2;
  local_6c8.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c8.m_name._M_string_length = 7;
  local_6c8.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_958.m_name,&local_7b8.m_name,&local_6c8.m_name,
             QP_KEY_TAG_TIME,(float)local_978._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ac0._0_8_,local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,
             local_a60,local_a5c);
  local_8f0.m_name._M_dataplus._M_p = (pointer)&local_8f0.m_name.field_2;
  local_8f0.m_name.field_2._M_allocated_capacity._0_6_ = 0x654d64616552;
  local_8f0.m_name.field_2._M_local_buf[6] = 'd';
  local_8f0.m_name.field_2._M_local_buf[7] = 'i';
  local_8f0.m_name.field_2._8_6_ = 0x74736f436e61;
  local_8f0.m_name._M_string_length = 0xe;
  local_8f0.m_name.field_2._M_local_buf[0xe] = '\0';
  local_730.m_name._M_dataplus._M_p = (pointer)&local_730.m_name.field_2;
  local_5b8.m_name._M_dataplus._M_p = (pointer)0x11;
  local_730.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_730,(ulong)&local_5b8);
  local_730.m_name.field_2._M_allocated_capacity = (size_type)local_5b8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_730.m_name._M_dataplus._M_p,"Read: Median cost",0x11);
  local_730.m_name._M_string_length = (size_type)local_5b8.m_name._M_dataplus._M_p;
  local_730.m_name._M_dataplus._M_p[(long)local_5b8.m_name._M_dataplus._M_p] = '\0';
  local_5b8.m_name._M_dataplus._M_p = (pointer)&local_5b8.m_name.field_2;
  local_5b8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5b8.m_name._M_string_length = 2;
  local_5b8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_9f0,&local_8f0.m_name,&local_730.m_name,&local_5b8.m_name,QP_KEY_TAG_TIME,
             local_d0.medianTime);
  tcu::TestLog::writeFloat
            (log,local_9f0.m_name._M_dataplus._M_p,local_9f0.m_desc._M_dataplus._M_p,
             local_9f0.m_unit._M_dataplus._M_p,local_9f0.m_tag,local_9f0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_unit._M_dataplus._M_p != &local_9f0.m_unit.field_2) {
    operator_delete(local_9f0.m_unit._M_dataplus._M_p,
                    local_9f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_desc._M_dataplus._M_p != &local_9f0.m_desc.field_2) {
    operator_delete(local_9f0.m_desc._M_dataplus._M_p,
                    local_9f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_name._M_dataplus._M_p != &local_9f0.m_name.field_2) {
    operator_delete(local_9f0.m_name._M_dataplus._M_p,
                    local_9f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.m_name._M_dataplus._M_p != &local_5b8.m_name.field_2) {
    operator_delete(local_5b8.m_name._M_dataplus._M_p,
                    CONCAT17(local_5b8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_5b8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_5b8.m_name.field_2._M_local_buf[2],
                                               local_5b8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.m_name._M_dataplus._M_p != &local_730.m_name.field_2) {
    operator_delete(local_730.m_name._M_dataplus._M_p,
                    local_730.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_name._M_dataplus._M_p != &local_8f0.m_name.field_2) {
    operator_delete(local_8f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8f0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8f0.m_name.field_2._M_local_buf[6],
                                      local_8f0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
    operator_delete(local_6c8.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_name._M_dataplus._M_p != &local_7b8.m_name.field_2) {
    operator_delete(local_7b8.m_name._M_dataplus._M_p,
                    (ulong)(local_7b8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_958.m_name.field_2._M_local_buf[6],
                                      local_958.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT53(local_660.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_660.m_name.field_2._M_local_buf[2],
                                      local_660.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_name._M_dataplus._M_p != &local_888.m_name.field_2) {
    operator_delete(local_888.m_name._M_dataplus._M_p,
                    local_888.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_name._M_dataplus._M_p != &local_820.m_name.field_2) {
    operator_delete(local_820.m_name._M_dataplus._M_p,
                    local_820.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_978,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x18);
  local_820.m_name._M_dataplus._M_p = (pointer)&local_820.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"TotalConstantCost","");
  local_888.m_name._M_dataplus._M_p = (pointer)&local_888.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_888,"Total: Approximated contant cost","");
  local_660.m_name._M_dataplus._M_p = (pointer)&local_660.m_name.field_2;
  local_660.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_660.m_name._M_string_length = 2;
  local_660.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a58,&local_820.m_name,&local_888.m_name,&local_660.m_name,
             QP_KEY_TAG_TIME,(float)local_978._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a58._0_8_,local_a38._M_dataplus._M_p,local_a18._M_dataplus._M_p,
             local_9f8,local_9f4);
  local_958.m_name._M_dataplus._M_p = (pointer)&local_958.m_name.field_2;
  local_958.m_name.field_2._M_allocated_capacity._0_6_ = 0x4c6c61746f54;
  local_958.m_name.field_2._M_local_buf[6] = 'i';
  local_958.m_name.field_2._M_local_buf[7] = 'n';
  local_958.m_name.field_2._8_6_ = 0x736f43726165;
  local_958.m_name.field_2._M_local_buf[0xe] = 't';
  local_958.m_name._M_string_length = 0xf;
  local_958.m_name.field_2._M_local_buf[0xf] = '\0';
  local_7b8.m_name._M_dataplus._M_p = (pointer)&local_7b8.m_name.field_2;
  local_9f0.m_name._M_dataplus._M_p = (char *)0x1f;
  local_7b8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7b8,(ulong)&local_9f0);
  local_7b8.m_name.field_2._M_allocated_capacity = (size_type)local_9f0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7b8.m_name._M_dataplus._M_p,"Total: Approximated linear cost",0x1f);
  local_7b8.m_name._M_string_length = (size_type)local_9f0.m_name._M_dataplus._M_p;
  local_7b8.m_name._M_dataplus._M_p[(long)local_9f0.m_name._M_dataplus._M_p] = '\0';
  local_6c8.m_name._M_dataplus._M_p = (pointer)&local_6c8.m_name.field_2;
  local_6c8.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c8.m_name._M_string_length = 7;
  local_6c8.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_958.m_name,&local_7b8.m_name,&local_6c8.m_name,
             QP_KEY_TAG_TIME,(float)local_978._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ac0._0_8_,local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,
             local_a60,local_a5c);
  local_8f0.m_name._M_dataplus._M_p = (pointer)&local_8f0.m_name.field_2;
  local_8f0.m_name.field_2._M_allocated_capacity._0_6_ = 0x4d6c61746f54;
  local_8f0.m_name.field_2._M_local_buf[6] = 'e';
  local_8f0.m_name.field_2._M_local_buf[7] = 'd';
  local_8f0.m_name.field_2._8_6_ = 0x736f436e6169;
  local_8f0.m_name.field_2._M_local_buf[0xe] = 't';
  local_8f0.m_name._M_string_length = 0xf;
  local_8f0.m_name.field_2._M_local_buf[0xf] = '\0';
  local_730.m_name._M_dataplus._M_p = (pointer)&local_730.m_name.field_2;
  local_5b8.m_name._M_dataplus._M_p = (pointer)0x12;
  local_730.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_730,(ulong)&local_5b8);
  local_730.m_name.field_2._M_allocated_capacity = (size_type)local_5b8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_730.m_name._M_dataplus._M_p,"Total: Median cost",0x12);
  local_730.m_name._M_string_length = (size_type)local_5b8.m_name._M_dataplus._M_p;
  local_730.m_name._M_dataplus._M_p[(long)local_5b8.m_name._M_dataplus._M_p] = '\0';
  local_5b8.m_name._M_dataplus._M_p = (pointer)&local_5b8.m_name.field_2;
  local_5b8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5b8.m_name._M_string_length = 2;
  local_5b8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_9f0,&local_8f0.m_name,&local_730.m_name,&local_5b8.m_name,QP_KEY_TAG_TIME,
             local_a8.medianTime);
  tcu::TestLog::writeFloat
            (log,local_9f0.m_name._M_dataplus._M_p,local_9f0.m_desc._M_dataplus._M_p,
             local_9f0.m_unit._M_dataplus._M_p,local_9f0.m_tag,local_9f0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_unit._M_dataplus._M_p != &local_9f0.m_unit.field_2) {
    operator_delete(local_9f0.m_unit._M_dataplus._M_p,
                    local_9f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_desc._M_dataplus._M_p != &local_9f0.m_desc.field_2) {
    operator_delete(local_9f0.m_desc._M_dataplus._M_p,
                    local_9f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_name._M_dataplus._M_p != &local_9f0.m_name.field_2) {
    operator_delete(local_9f0.m_name._M_dataplus._M_p,
                    local_9f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.m_name._M_dataplus._M_p != &local_5b8.m_name.field_2) {
    operator_delete(local_5b8.m_name._M_dataplus._M_p,
                    CONCAT17(local_5b8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_5b8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_5b8.m_name.field_2._M_local_buf[2],
                                               local_5b8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.m_name._M_dataplus._M_p != &local_730.m_name.field_2) {
    operator_delete(local_730.m_name._M_dataplus._M_p,
                    local_730.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_name._M_dataplus._M_p != &local_8f0.m_name.field_2) {
    operator_delete(local_8f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8f0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8f0.m_name.field_2._M_local_buf[6],
                                      local_8f0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
    operator_delete(local_6c8.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_name._M_dataplus._M_p != &local_7b8.m_name.field_2) {
    operator_delete(local_7b8.m_name._M_dataplus._M_p,
                    (ulong)(local_7b8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_958.m_name.field_2._M_local_buf[6],
                                      local_958.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT53(local_660.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_660.m_name.field_2._M_local_buf[2],
                                      local_660.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_name._M_dataplus._M_p != &local_888.m_name.field_2) {
    operator_delete(local_888.m_name._M_dataplus._M_p,
                    local_888.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_name._M_dataplus._M_p != &local_820.m_name.field_2) {
    operator_delete(local_820.m_name._M_dataplus._M_p,
                    local_820.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_750._M_dataplus._M_p);
  local_a58._0_8_ = &aStack_a48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a58,"Results","");
  local_ac0._0_8_ = &local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"Results","");
  tcu::ScopedLogSection::ScopedLogSection(&local_200,log,(string *)local_a58,(string *)local_ac0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar16 = (float)((pRVar2[-1].renderDataSize + pRVar8->renderDataSize) / 2);
  local_24c = local_54c.coefficient * fVar16;
  local_248 = local_54c.offset + local_24c;
  uVar12 = (long)pRVar2 - (long)pRVar8;
  endNdx = (int)(((uint)(uVar12 >> 0x25) & 1) + (int)(uVar12 >> 6)) >> 1;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_a58,samples,0,endNdx,1,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_ac0,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x28);
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar15 = (float)pRVar8->renderDataSize;
  local_224 = (float)pRVar2[-1].renderDataSize;
  local_988._0_4_ = fVar15;
  local_230 = (float)local_a58._0_4_;
  local_48 = ZEXT416((uint)local_a58._12_4_);
  local_22c = (float)local_ac0._0_4_;
  local_58 = ZEXT416((uint)fStack_ab4);
  local_228 = getAreaBetweenLines(fVar15,local_224,(float)local_a58._0_4_,(float)local_a58._12_4_,
                                  (float)local_ac0._0_4_,fStack_ab4);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_a58,samples,0,
             (int)((ulong)((long)pRVar2 - (long)pRVar8) >> 6),2,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_ac0,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),2,0x28);
  local_234 = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  local_238 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  local_244 = (float)local_a58._0_4_;
  local_68 = ZEXT416((uint)local_a58._12_4_);
  local_240 = (float)local_ac0._0_4_;
  local_78 = ZEXT416((uint)fStack_ab4);
  local_23c = getAreaBetweenLines(local_234,local_238,(float)local_a58._0_4_,(float)local_a58._12_4_
                                  ,(float)local_ac0._0_4_,fStack_ab4);
  local_978._0_8_ = &local_968;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"ResultLinearity","");
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"Sample linearity","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"%","");
  fVar15 = (float)local_48._0_4_ * (float)local_988._0_4_ + local_230;
  fVar17 = (float)local_58._0_4_ * (float)local_988._0_4_ + local_22c;
  uVar13 = -(uint)(fVar15 <= fVar17);
  fVar18 = (float)local_48._0_4_ * local_224 + local_230;
  fVar19 = (float)local_58._0_4_ * local_224 + local_22c;
  uVar14 = -(uint)(fVar19 <= fVar18);
  fVar15 = ((float)(~uVar14 & (uint)fVar19 | (uint)fVar18 & uVar14) -
           (float)(~uVar13 & (uint)fVar17 | (uint)fVar15 & uVar13)) *
           (local_224 - (float)local_988._0_4_);
  fVar17 = (float)(~-(uint)(fVar15 < 1e-06) & (uint)(1.0 - local_228 / fVar15));
  fVar15 = 1.0;
  if (fVar17 <= 1.0) {
    fVar15 = fVar17;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a58,(string *)local_978,&local_750,&local_270,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar17 < 0.0) & (uint)(fVar15 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a58._0_8_,local_a38._M_dataplus._M_p,local_a18._M_dataplus._M_p,
             local_9f8,local_9f4);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"SampleTemporalStability","")
  ;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,"Sample temporal stability","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"%","");
  fVar15 = (float)local_68._0_4_ * local_234 + local_244;
  fVar17 = (float)local_78._0_4_ * local_234 + local_240;
  uVar13 = -(uint)(fVar15 <= fVar17);
  fVar18 = (float)local_68._0_4_ * local_238 + local_244;
  fVar19 = (float)local_78._0_4_ * local_238 + local_240;
  uVar14 = -(uint)(fVar19 <= fVar18);
  fVar15 = ((float)(~uVar14 & (uint)fVar19 | (uint)fVar18 & uVar14) -
           (float)(~uVar13 & (uint)fVar17 | (uint)fVar15 & uVar13)) * (local_238 - local_234);
  fVar17 = (float)(~-(uint)(fVar15 < 1e-06) & (uint)(1.0 - local_23c / fVar15));
  fVar15 = 1.0;
  if (fVar17 <= 1.0) {
    fVar15 = fVar17;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_290,&local_2b0,&local_2d0,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar17 < 0.0) & (uint)(fVar15 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_ac0._0_8_,local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,
             local_a60,local_a5c);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f0,"ApproximatedConstantCost","");
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d8,"Approximated contant cost","");
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_9f0,&local_2f0,&local_5d8,&local_310,QP_KEY_TAG_TIME,local_54c.offset);
  tcu::TestLog::writeFloat
            (log,local_9f0.m_name._M_dataplus._M_p,local_9f0.m_desc._M_dataplus._M_p,
             local_9f0.m_unit._M_dataplus._M_p,local_9f0.m_tag,local_9f0.m_value);
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_330,"ApproximatedConstantCostConfidence60Lower","");
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f8,"Approximated contant cost 60% confidence lower limit","");
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_820,&local_330,&local_5f8,&local_350,QP_KEY_TAG_TIME,
             local_54c.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_820.m_name._M_dataplus._M_p,local_820.m_desc._M_dataplus._M_p,
             local_820.m_unit._M_dataplus._M_p,local_820.m_tag,local_820.m_value);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_370,"ApproximatedConstantCostConfidence60Upper","");
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"Approximated contant cost 60% confidence upper limit","");
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_888,&local_370,&local_390,&local_3b0,QP_KEY_TAG_TIME,
             local_54c.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_888.m_name._M_dataplus._M_p,local_888.m_desc._M_dataplus._M_p,
             local_888.m_unit._M_dataplus._M_p,local_888.m_tag,local_888.m_value);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"ApproximatedLinearCost","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,"Approximated linear cost","");
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_660,&local_3d0,&local_3f0,&local_410,QP_KEY_TAG_TIME,
             local_54c.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_660.m_name._M_dataplus._M_p,local_660.m_desc._M_dataplus._M_p,
             local_660.m_unit._M_dataplus._M_p,local_660.m_tag,local_660.m_value);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_430,"ApproximatedLinearCostConfidence60Lower","");
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_450,"Approximated linear cost 60% confidence lower limit","");
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_958,&local_430,&local_450,&local_470,QP_KEY_TAG_TIME,
             local_54c.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_958.m_name._M_dataplus._M_p,local_958.m_desc._M_dataplus._M_p,
             local_958.m_unit._M_dataplus._M_p,local_958.m_tag,local_958.m_value);
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_490,"ApproximatedLinearCostConfidence60Upper","");
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b0,"Approximated linear cost 60% confidence upper limit","");
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_7b8,&local_490,&local_4b0,&local_4d0,QP_KEY_TAG_TIME,
             local_54c.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_7b8.m_name._M_dataplus._M_p,local_7b8.m_desc._M_dataplus._M_p,
             local_7b8.m_unit._M_dataplus._M_p,local_7b8.m_tag,local_7b8.m_value);
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"ApproximatedProcessRate","")
  ;
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_510,"Approximated processing rate","");
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"MB / s","");
  fVar15 = fVar16 / ((local_248 / 1000.0) / 1000.0);
  local_988 = ZEXT416((uint)fVar15);
  tcu::LogNumber<float>::LogNumber
            (&local_6c8,&local_4f0,&local_510,&local_530,QP_KEY_TAG_PERFORMANCE,
             fVar15 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_6c8.m_name._M_dataplus._M_p,local_6c8.m_desc._M_dataplus._M_p,
             local_6c8.m_unit._M_dataplus._M_p,local_6c8.m_tag,local_6c8.m_value);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"ApproximatedProcessRateNoConstant","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,"Approximated processing rate without constant cost","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_8f0,&local_220,&local_1d8,&local_1f8,QP_KEY_TAG_PERFORMANCE,
             (fVar16 / ((local_24c / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_8f0.m_name._M_dataplus._M_p,local_8f0.m_desc._M_dataplus._M_p,
             local_8f0.m_unit._M_dataplus._M_p,local_8f0.m_tag,local_8f0.m_value);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"SampleMedianTime","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Median sample time","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_730,&local_118,&local_138,&local_158,QP_KEY_TAG_TIME,local_b4);
  tcu::TestLog::writeFloat
            (log,local_730.m_name._M_dataplus._M_p,local_730.m_desc._M_dataplus._M_p,
             local_730.m_unit._M_dataplus._M_p,local_730.m_tag,local_730.m_value);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"SampleMedianProcess","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Median processing rate","");
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_5b8,&local_178,&local_198,&local_1b8,QP_KEY_TAG_PERFORMANCE,
             local_94 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_5b8.m_name._M_dataplus._M_p,local_5b8.m_desc._M_dataplus._M_p,
             local_5b8.m_unit._M_dataplus._M_p,local_5b8.m_tag,local_5b8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.m_unit._M_dataplus._M_p != &local_5b8.m_unit.field_2) {
    operator_delete(local_5b8.m_unit._M_dataplus._M_p,
                    local_5b8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.m_desc._M_dataplus._M_p != &local_5b8.m_desc.field_2) {
    operator_delete(local_5b8.m_desc._M_dataplus._M_p,
                    local_5b8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.m_name._M_dataplus._M_p != &local_5b8.m_name.field_2) {
    operator_delete(local_5b8.m_name._M_dataplus._M_p,
                    CONCAT17(local_5b8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_5b8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_5b8.m_name.field_2._M_local_buf[2],
                                               local_5b8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.m_unit._M_dataplus._M_p != &local_730.m_unit.field_2) {
    operator_delete(local_730.m_unit._M_dataplus._M_p,
                    local_730.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.m_desc._M_dataplus._M_p != &local_730.m_desc.field_2) {
    operator_delete(local_730.m_desc._M_dataplus._M_p,
                    local_730.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730.m_name._M_dataplus._M_p != &local_730.m_name.field_2) {
    operator_delete(local_730.m_name._M_dataplus._M_p,
                    local_730.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_unit._M_dataplus._M_p != &local_8f0.m_unit.field_2) {
    operator_delete(local_8f0.m_unit._M_dataplus._M_p,
                    local_8f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_desc._M_dataplus._M_p != &local_8f0.m_desc.field_2) {
    operator_delete(local_8f0.m_desc._M_dataplus._M_p,
                    local_8f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_name._M_dataplus._M_p != &local_8f0.m_name.field_2) {
    operator_delete(local_8f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8f0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8f0.m_name.field_2._M_local_buf[6],
                                      local_8f0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_unit._M_dataplus._M_p != &local_6c8.m_unit.field_2) {
    operator_delete(local_6c8.m_unit._M_dataplus._M_p,
                    local_6c8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_desc._M_dataplus._M_p != &local_6c8.m_desc.field_2) {
    operator_delete(local_6c8.m_desc._M_dataplus._M_p,
                    local_6c8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
    operator_delete(local_6c8.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,
                    CONCAT53(local_530.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_530.field_2._M_local_buf[2],
                                      local_530.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,
                    CONCAT17(local_4f0.field_2._M_local_buf[7],
                             local_4f0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_unit._M_dataplus._M_p != &local_7b8.m_unit.field_2) {
    operator_delete(local_7b8.m_unit._M_dataplus._M_p,
                    local_7b8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_desc._M_dataplus._M_p != &local_7b8.m_desc.field_2) {
    operator_delete(local_7b8.m_desc._M_dataplus._M_p,
                    local_7b8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_name._M_dataplus._M_p != &local_7b8.m_name.field_2) {
    operator_delete(local_7b8.m_name._M_dataplus._M_p,
                    (ulong)(local_7b8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT53(local_4d0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4d0.field_2._M_local_buf[2],
                                      local_4d0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT17(local_4b0.field_2._M_local_buf[7],
                             local_4b0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_unit._M_dataplus._M_p != &local_958.m_unit.field_2) {
    operator_delete(local_958.m_unit._M_dataplus._M_p,
                    local_958.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_desc._M_dataplus._M_p != &local_958.m_desc.field_2) {
    operator_delete(local_958.m_desc._M_dataplus._M_p,
                    local_958.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_958.m_name.field_2._M_local_buf[6],
                                      local_958.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT53(local_470.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_470.field_2._M_local_buf[2],
                                      local_470.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT26(local_450.field_2._M_allocated_capacity._6_2_,
                             local_450.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_unit._M_dataplus._M_p != &local_660.m_unit.field_2) {
    operator_delete(local_660.m_unit._M_dataplus._M_p,
                    local_660.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_desc._M_dataplus._M_p != &local_660.m_desc.field_2) {
    operator_delete(local_660.m_desc._M_dataplus._M_p,
                    local_660.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT53(local_660.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_660.m_name.field_2._M_local_buf[2],
                                      local_660.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,
                    CONCAT53(local_410.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_410.field_2._M_local_buf[2],
                                      local_410.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT17(local_3f0.field_2._M_local_buf[7],
                             local_3f0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT17(local_3d0.field_2._M_local_buf[7],
                             local_3d0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_unit._M_dataplus._M_p != &local_888.m_unit.field_2) {
    operator_delete(local_888.m_unit._M_dataplus._M_p,
                    local_888.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_desc._M_dataplus._M_p != &local_888.m_desc.field_2) {
    operator_delete(local_888.m_desc._M_dataplus._M_p,
                    local_888.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888.m_name._M_dataplus._M_p != &local_888.m_name.field_2) {
    operator_delete(local_888.m_name._M_dataplus._M_p,
                    local_888.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT53(local_3b0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3b0.field_2._M_local_buf[2],
                                      local_3b0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_unit._M_dataplus._M_p != &local_820.m_unit.field_2) {
    operator_delete(local_820.m_unit._M_dataplus._M_p,
                    local_820.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_desc._M_dataplus._M_p != &local_820.m_desc.field_2) {
    operator_delete(local_820.m_desc._M_dataplus._M_p,
                    local_820.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820.m_name._M_dataplus._M_p != &local_820.m_name.field_2) {
    operator_delete(local_820.m_name._M_dataplus._M_p,
                    local_820.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,
                    CONCAT53(local_350.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_350.field_2._M_local_buf[2],
                                      local_350.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,(ulong)(local_5f8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_unit._M_dataplus._M_p != &local_9f0.m_unit.field_2) {
    operator_delete(local_9f0.m_unit._M_dataplus._M_p,
                    local_9f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_desc._M_dataplus._M_p != &local_9f0.m_desc.field_2) {
    operator_delete(local_9f0.m_desc._M_dataplus._M_p,
                    local_9f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_name._M_dataplus._M_p != &local_9f0.m_name.field_2) {
    operator_delete(local_9f0.m_name._M_dataplus._M_p,
                    local_9f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,(ulong)(local_5d8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,
                    CONCAT17(local_2f0.field_2._M_local_buf[7],
                             local_2f0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,
                    CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2d0.field_2._M_allocated_capacity._4_2_,
                                      local_2d0.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT35(local_2b0.field_2._M_allocated_capacity._5_3_,
                             local_2b0.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._0_8_ != &aStack_a48) {
    operator_delete((void *)local_a58._0_8_,aStack_a48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT26(local_270.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                      local_270.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,
                    CONCAT26(local_750.field_2._M_allocated_capacity._6_2_,
                             local_750.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._0_8_ != &local_968) {
    operator_delete((void *)local_978._0_8_,local_968._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection(local_200.m_log);
  RVar20.renderRateAtRange = (float)local_988._0_4_;
  RVar20.renderRateMedian = local_94;
  RVar20.renderRateAtInfinity = local_94;
  return RVar20;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}